

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

cmDirectoryId * __thiscall
cmMakefile::GetDirectoryId(cmDirectoryId *__return_storage_ptr__,cmMakefile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  char buf [32];
  char *local_68;
  size_type local_60;
  char local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  char local_48 [40];
  
  snprintf(local_48,0x20,"(%p)",this);
  local_68 = &local_58;
  sVar2 = strlen(local_48);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,local_48,local_48 + sVar2);
  paVar1 = &(__return_storage_ptr__->String).field_2;
  (__return_storage_ptr__->String)._M_dataplus._M_p = (pointer)paVar1;
  if (local_68 == &local_58) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_57,local_58);
    *(undefined8 *)((long)&(__return_storage_ptr__->String).field_2 + 8) = uStack_50;
  }
  else {
    (__return_storage_ptr__->String)._M_dataplus._M_p = local_68;
    (__return_storage_ptr__->String).field_2._M_allocated_capacity = CONCAT71(uStack_57,local_58);
  }
  (__return_storage_ptr__->String)._M_string_length = local_60;
  return __return_storage_ptr__;
}

Assistant:

cmDirectoryId cmMakefile::GetDirectoryId() const
{
  // Use the instance pointer value to uniquely identify this directory.
  // If we ever need to expose this to CMake language code we should
  // add a read-only property in cmMakefile::GetProperty.
  char buf[32];
  snprintf(buf, sizeof(buf), "(%p)",
           static_cast<void const*>(this)); // cast avoids format warning
  return std::string(buf);
}